

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

bool BicTest3<Blob<88>,Blob<128>>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  pfHash p_Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  char cVar6;
  ulong uVar7;
  long lVar8;
  int out2;
  pfHash p_Var9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int keybit;
  long lVar14;
  ulong uVar15;
  int out1;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined8 in_XMM7_Qb;
  long local_e8;
  uint local_dc;
  uint local_d8;
  allocator_type local_d1;
  double local_d0;
  uint local_c4;
  ulong local_c0;
  pfHash local_b8;
  long local_b0;
  int local_a4;
  long local_a0;
  vector<int,_std::allocator<int>_> bins;
  Blob<128> h2;
  Blob<128> h1;
  Blob<88> key;
  Rand r;
  Blob<128> d;
  
  uVar7 = CONCAT71(in_register_00000011,verbose) & 0xffffffff;
  local_b8 = hash;
  Rand::reseed(&r,0x2ea2);
  Blob<88>::Blob(&key);
  Blob<128>::Blob(&h1);
  Blob<128>::Blob(&h2);
  d.bytes[0] = '\0';
  d.bytes[1] = '\0';
  d.bytes[2] = '\0';
  d.bytes[3] = '\0';
  std::vector<int,_std::allocator<int>_>::vector
            (&bins,0x580000,(value_type_conflict1 *)&d,&local_d1);
  local_a0 = 0x10;
  local_c4 = (uint)CONCAT71(in_register_00000011,verbose);
  uVar11 = 0;
  local_a4 = reps;
  while (uVar11 != 0x58) {
    if ((uVar11 & 7) == 0) {
      putchar(0x2e);
    }
    local_b0 = (long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + local_a0;
    local_c0 = uVar11;
    for (uVar5 = 0; uVar11 = local_c0, uVar5 != (~(reps >> 0x1f) & reps); uVar5 = uVar5 + 1) {
      Rand::rand_p(&r,&key,0xb);
      p_Var9 = local_b8;
      (*local_b8)(&key,0xb,0,&h1);
      flipbit<Blob<88>>(&key,(uint32_t)uVar11);
      (*p_Var9)(&key,0xb,0,&h2);
      Blob<128>::operator^(&d,&h1);
      local_e8 = local_b0;
      lVar8 = -0x7f;
      dVar22 = (double)0;
      while (dVar22 != 6.27463370218383e-322) {
        local_d0 = (double)((long)dVar22 + 1);
        lVar12 = local_e8;
        for (lVar14 = lVar8; lVar14 != 0; lVar14 = lVar14 + 1) {
          uVar3 = getbit<Blob<128>>(&d,SUB84(dVar22,0));
          uVar4 = getbit<Blob<128>>(&d,(int)lVar14 + 0x80);
          piVar1 = (int *)(lVar12 + (ulong)(uVar4 * 2 | uVar3) * 4);
          *piVar1 = *piVar1 + 1;
          lVar12 = lVar12 + 0x10;
        }
        local_e8 = local_e8 + 0x810;
        lVar8 = lVar8 + 1;
        dVar22 = local_d0;
      }
      uVar7 = (ulong)local_c4;
    }
    local_a0 = local_a0 + 0x40000;
    uVar11 = local_c0 + 1;
  }
  putchar(10);
  dVar22 = (double)(local_a4 / 2);
  auVar18 = ZEXT864(0) << 0x40;
  p_Var9 = (pfHash)0x1;
  auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  local_c0 = 0x10;
  uVar11 = 0;
  local_d8 = 0;
  local_dc = 0;
  local_d0 = dVar22;
  for (uVar16 = 0; uVar13 = local_c0, p_Var2 = p_Var9, uVar16 != 0x7f; uVar16 = uVar16 + 1) {
    while( true ) {
      local_b8 = p_Var2;
      p_Var2 = local_b8;
      cVar6 = (char)uVar7;
      if (p_Var9 == (pfHash)0x80) break;
      if (cVar6 != '\0') {
        printf("(%3d,%3d) - ",uVar16 & 0xffffffff,(ulong)p_Var9 & 0xffffffff);
        auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar18 = ZEXT864(auVar18._0_8_);
        dVar22 = local_d0;
      }
      local_b0 = uVar13;
      for (uVar15 = 0; uVar15 != 0x58; uVar15 = uVar15 + 1) {
        auVar21 = ZEXT816(0) << 0x40;
        lVar8 = 0;
        while (lVar8 != 4) {
          lVar12 = lVar8 * 4;
          lVar8 = lVar8 + 1;
          auVar19._0_8_ =
               (double)*(int *)((long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar12 + uVar13) / dVar22;
          auVar19._8_8_ = in_XMM7_Qb;
          auVar19 = vfmadd213sd_fma(auVar19,auVar23._0_16_,auVar24._0_16_);
          auVar19 = vandpd_avx(auVar19,auVar25._0_16_);
          auVar21 = vmaxsd_avx(auVar19,auVar21);
        }
        dVar20 = auVar21._0_8_;
        if (auVar18._0_8_ < dVar20) {
          uVar11 = uVar15 & 0xffffffff;
          auVar18 = ZEXT1664(auVar21);
          local_dc = (uint)uVar16;
          local_d8 = (uint)p_Var9;
        }
        if (cVar6 != '\0') {
          iVar10 = 0x2e;
          if ((0.01 <= dVar20) && (iVar10 = 0x6f, 0.05 <= dVar20)) {
            iVar10 = (uint)(0.33 <= dVar20) * 9 + 0x4f;
          }
          putchar(iVar10);
          auVar18 = ZEXT864(auVar18._0_8_);
          auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          dVar22 = local_d0;
        }
        uVar13 = uVar13 + 0x40000;
      }
      if (cVar6 != '\0') {
        putchar(10);
        auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar18 = ZEXT864((ulong)auVar18._0_8_);
        dVar22 = local_d0;
      }
      p_Var9 = p_Var9 + 1;
      uVar13 = local_b0 + 0x10;
      p_Var2 = local_b8;
    }
    if (cVar6 != '\0') {
      iVar10 = 100;
      while (bVar17 = iVar10 != 0, iVar10 = iVar10 + -1, bVar17) {
        putchar(0x2d);
      }
      putchar(10);
      auVar18 = ZEXT864(auVar18._0_8_);
      auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      uVar7 = (ulong)local_c4;
      dVar22 = local_d0;
    }
    local_c0 = local_c0 + 0x810;
    p_Var9 = p_Var2 + 1;
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar11,(ulong)local_dc,(ulong)local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bins.super__Vector_base<int,_std::allocator<int>_>);
  return auVar18._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}